

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O1

Token lex(ptrlen *text,ptrlen *token,char **err)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  _Bool _Var4;
  int iVar5;
  long lVar6;
  uint uVar7;
  char *pcVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  bool bVar12;
  ptrlen pl2;
  ptrlen pl1;
  Token local_54;
  
  pbVar11 = (byte *)text->ptr;
  pbVar1 = pbVar11 + text->len;
  local_54 = TOK_END;
  pbVar10 = pbVar11;
  if (0 < (long)text->len) {
    do {
      bVar2 = *pbVar10;
      if (4 < bVar2 - 9) {
        uVar7 = (uint)bVar2;
        pbVar11 = pbVar10;
        if (uVar7 < 0x2a) {
          if ((ulong)uVar7 == 0x20) goto LAB_0016885e;
          if ((0x34200000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_00168888;
        }
        else {
LAB_00168888:
          if (bVar2 != 0x7c) {
            if ((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
              pcVar8 = "unexpected character in expression";
              uVar7 = bVar2 - 0x2a;
              if ((0x35 < uVar7) || ((0x2a000000210039U >> ((ulong)uVar7 & 0x3f) & 1) == 0))
              goto LAB_00168975;
            }
            pbVar9 = pbVar10 + 1;
            local_54 = TOK_ATOM;
            pbVar11 = pbVar9;
            while ((pbVar9 < pbVar1 &&
                   (((bVar2 = *pbVar9, (byte)(bVar2 - 0x30) < 10 ||
                     ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
                    ((pbVar11 = pbVar9, bVar2 - 0x2a < 0x36 &&
                     ((0x2a000000210039U >> ((ulong)(bVar2 - 0x2a) & 0x3f) & 1) != 0))))))) {
              pbVar9 = pbVar9 + 1;
              pbVar11 = pbVar1;
            }
            break;
          }
        }
        local_54 = TOK_ERROR;
        lVar6 = 0;
        goto LAB_001688b9;
      }
LAB_0016885e:
      pbVar11 = pbVar10 + 1;
      pbVar10 = pbVar11;
    } while (pbVar11 < pbVar1);
  }
  goto LAB_00168938;
  while (lVar6 = lVar6 + 0x18, lVar6 != 0x78) {
LAB_001688b9:
    uVar3 = *(ulong *)((long)&lex::operators[0].text.len + lVar6);
    bVar12 = true;
    if ((ulong)((long)pbVar1 - (long)pbVar11) < uVar3) {
      iVar5 = 0;
    }
    else {
      pl2.len = uVar3;
      pl2.ptr = pbVar11;
      pl1.len = uVar3;
      pl1.ptr = *(void **)((long)&lex::operators[0].text.ptr + lVar6);
      _Var4 = ptrlen_eq_ptrlen(pl1,pl2);
      bVar12 = !_Var4;
      if (bVar12) {
        iVar5 = 0;
      }
      else {
        pbVar11 = pbVar11 + uVar3;
        local_54 = *(Token *)((long)&lex::operators[0].type + lVar6);
        iVar5 = 4;
      }
    }
    if (!bVar12) goto LAB_0016891b;
  }
  iVar5 = 5;
LAB_0016891b:
  if (iVar5 == 5) {
    pcVar8 = "unrecognised boolean operator";
LAB_00168975:
    pcVar8 = dupstr(pcVar8);
    *err = pcVar8;
    local_54 = TOK_ERROR;
    pbVar11 = pbVar11 + 1;
  }
  else if (iVar5 != 4) {
    return local_54;
  }
LAB_00168938:
  token->ptr = pbVar10;
  token->len = (long)pbVar11 - (long)pbVar10;
  text->ptr = pbVar11;
  text->len = (long)pbVar1 - (long)pbVar11;
  return local_54;
}

Assistant:

static Token lex(ptrlen *text, ptrlen *token, char **err)
{
    const char *p = text->ptr, *e = p + text->len;
    Token type = TOK_ERROR;

    /* Skip whitespace */
    while (p < e && is_space(*p))
        p++;

    const char *start = p;

    if (!(p < e)) {
        type = TOK_END;
        goto out;
    }

    if (is_operator_char(*p)) {
        /* Match boolean-expression tokens */
        static const struct operator {
            ptrlen text;
            Token type;
        } operators[] = {
            {PTRLEN_DECL_LITERAL("("), TOK_LPAR},
            {PTRLEN_DECL_LITERAL(")"), TOK_RPAR},
            {PTRLEN_DECL_LITERAL("&&"), TOK_AND},
            {PTRLEN_DECL_LITERAL("||"), TOK_OR},
            {PTRLEN_DECL_LITERAL("!"), TOK_NOT},
        };

        for (size_t i = 0; i < lenof(operators); i++) {
            const struct operator *op = &operators[i];
            if (e - p >= op->text.len &&
                ptrlen_eq_ptrlen(op->text, make_ptrlen(p, op->text.len))) {
                p += op->text.len;
                type = op->type;
                goto out;
            }
        }

        /*
         * Report an error if one of the operator characters is used
         * in a way that doesn't match something in that table (e.g. a
         * single &).
         */
        p++;
        type = TOK_ERROR;
        *err = dupstr("unrecognised boolean operator");
        goto out;
    } else if (is_atom_char(*p)) {
        /*
         * Match an 'atom' token, which is any non-empty sequence of
         * characters from the combined set that allows hostname
         * wildcards, IP address ranges and special predicates like
         * port numbers.
         */
        do {
            p++;
        } while (p < e && is_atom_char(*p));

        type = TOK_ATOM;
        goto out;
    } else {
        /*
         * Otherwise, report an error.
         */
        p++;
        type = TOK_ERROR;
        *err = dupstr("unexpected character in expression");
        goto out;
    }

  out:
    *token = make_ptrlen(start, p - start);
    text->ptr = p;
    text->len = e - p;
    return type;
}